

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

void __thiscall
xmrig::Threads<xmrig::CpuThreads>::toJSON(Threads<xmrig::CpuThreads> *this,Value *out,Document *doc)

{
  bool bVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *value;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  Document *in_stack_00000020;
  CpuThreads *in_stack_00000028;
  CpuThreads *ct;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined8 in_stack_ffffffffffffffc0;
  GenericStringRef<char> local_38;
  
  value = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GetAllocator(in_RDX);
  bVar1 = has((Threads<xmrig::CpuThreads> *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                   get((Threads<xmrig::CpuThreads> *)in_stack_ffffffffffffffc0);
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_38,(char (*) [8])"cn/blur");
    CpuThreads::toJSON(in_stack_00000028,in_stack_00000020);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_RSI,(StringRefType *)in_RDX,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)value,allocator_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&stack0xffffffffffffffb8);
  }
  return;
}

Assistant:

void xmrig::Threads<T>::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    if (has())
    {
        auto &ct = get();
        out.AddMember("cn/blur", ct.toJSON(doc), allocator);
    }   
}